

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CycleBreakingAbstract.h
# Opt level: O3

DFA<covenant::Sym> * __thiscall
covenant::CycleBreakingAbstract<covenant::Sym>::do_abstraction
          (DFA<covenant::Sym> *__return_storage_ptr__,CycleBreakingAbstract<covenant::Sym> *this,
          CFG *g,bool is_regular)

{
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  const_iterator cVar4;
  string *psVar5;
  undefined7 in_register_00000009;
  sp_counted_base *__n;
  void *__buf;
  dfa_t *__return_storage_ptr___00;
  CFG *pCVar6;
  shared_count *psVar7;
  CycleBreaking<covenant::Sym> transformer;
  DFA<covenant::Sym> dfa;
  CFG str_reg_cfg;
  CycleBreaking<covenant::Sym> local_5e5;
  undefined4 local_5e4;
  CFG *local_5e0;
  shared_count *local_5d8;
  dfa_t *local_5d0;
  DFA<covenant::Sym> local_5c8;
  undefined1 *local_558;
  long local_550;
  undefined1 local_548 [16];
  undefined1 *local_538;
  long local_530;
  undefined1 local_528 [16];
  vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
  local_518;
  undefined1 local_500 [48];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_4d0;
  pointer local_4b8;
  uint local_4b0;
  pointer local_4a8;
  uint local_4a0;
  pointer local_498;
  CFGConnect local_480;
  pointer local_3f8;
  table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_unsigned_int,_unsigned_int,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
  local_3e0;
  shared_count local_3a8 [2];
  vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
  local_398;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_380;
  _Bit_type *local_368;
  uint local_360;
  _Bit_type *local_358;
  uint local_350;
  _Bit_pointer local_348;
  undefined1 local_338 [24];
  vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
  local_320;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_308;
  pointer local_2f0;
  uint uStack_2e8;
  pointer local_2e0;
  uint uStack_2d8;
  undefined4 uStack_2d4;
  pointer local_2d0;
  undefined1 local_2b8 [24];
  vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
  local_2a0;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_288;
  _Bit_type *local_270;
  uint uStack_268;
  pointer local_260;
  uint uStack_258;
  undefined4 uStack_254;
  pointer local_250;
  element_type *local_240;
  shared_count local_238;
  CFG local_230;
  CFG local_1b0;
  CFG local_130;
  CFG local_b0;
  
  local_5e4 = (undefined4)CONCAT71(in_register_00000009,is_regular);
  local_5c8._tfac.px = (g->_tfac).px;
  __n = (g->_tfac).pn.pi_;
  psVar7 = &local_5c8._tfac.pn;
  if (__n == (sp_counted_base *)0x0) {
    local_5c8._tfac.pn.pi_ = (sp_counted_base *)0x0;
  }
  else {
    LOCK();
    __n->use_count_ = __n->use_count_ + 1;
    UNLOCK();
    LOCK();
    __n->use_count_ = __n->use_count_ + 1;
    UNLOCK();
    local_5c8._tfac.pn.pi_ = __n;
  }
  local_5c8.start = 0;
  local_5c8.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_5c8.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._8_8_ =
       local_5c8.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
       ._M_finish.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
  local_5c8.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  local_5c8.trans.
  super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_5c8.trans.
  super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5c8.trans.
  super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5c8.eps.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_5c8.eps.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5c8.eps.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_5c8.eps.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  local_5c8.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p._0_4_ = 0;
  local_5c8.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p._4_4_ = 0;
  local_5c8.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  local_5e0 = g;
  local_240 = local_5c8._tfac.px;
  local_238.pi_ = __n;
  boost::detail::shared_count::~shared_count(&local_238);
  local_5d8 = psVar7;
  local_5d0 = __return_storage_ptr__;
  if ((char)local_5e4 == '\0') {
    if (avy::AvyLogFlag != '\0') {
      local_500._0_8_ = local_500 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_500,"verbose","");
      cVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)avy::AvyLog_abi_cxx11_,(key_type *)local_500);
      if ((undefined1 *)local_500._0_8_ != local_500 + 0x10) {
        operator_delete((void *)local_500._0_8_);
      }
      if (cVar4._M_node != (_Base_ptr)(avy::AvyLog_abi_cxx11_ + 8)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Applied cycle breaking abstraction.\n",0x24);
      }
    }
    CFG::CFG(&local_130,local_5e0);
    CycleBreaking<covenant::Sym>::Approximate((CFG *)local_338,&local_5e5,&local_130);
    CFG::~CFG(&local_130);
    if (avy::AvyLogFlag == '\x01') {
      local_500._0_8_ = local_500 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_500,"abstraction","");
      cVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)avy::AvyLog_abi_cxx11_,(key_type *)local_500);
      if ((undefined1 *)local_500._0_8_ != local_500 + 0x10) {
        operator_delete((void *)local_500._0_8_);
      }
      if (cVar4._M_node != (_Base_ptr)(avy::AvyLog_abi_cxx11_ + 8)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Approximated regular grammar:\n",0x1e);
        CFG::CFG(&local_1b0,(CFG *)local_338);
        CFG::write(&local_1b0,0x1ab2b8,__buf,(size_t)__n);
        CFG::~CFG(&local_1b0);
      }
    }
    CFG::CFG(&local_230,(CFG *)local_338);
    StronglyRegularToFA<covenant::Sym>::StronglyRegularToFA
              ((StronglyRegularToFA<covenant::Sym> *)local_500,&local_230);
    CFG::~CFG(&local_230);
    StronglyRegularToFA<covenant::Sym>::make_fa
              ((DFA<covenant::Sym> *)local_2b8,(StronglyRegularToFA<covenant::Sym> *)local_500);
    uVar2 = local_2b8._8_8_;
    uVar1 = local_2b8._0_8_;
    local_2b8._0_8_ = (element_type *)0x0;
    local_2b8._8_8_ = (sp_counted_base *)0x0;
    local_518.
    super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_5c8._tfac.px;
    local_518.
    super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_5c8._tfac.pn.pi_;
    local_5c8._tfac.px = (element_type *)uVar1;
    local_5c8._tfac.pn.pi_ = (sp_counted_base *)uVar2;
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &local_518.
                super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish);
    local_518.
    super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_5c8.trans.
         super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_518.
    super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_5c8.trans.
         super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_518.
    super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_5c8.trans.
         super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_5c8.start = local_2b8._16_4_;
    local_5c8.trans.
    super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_2a0.
         super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_5c8.trans.
    super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_2a0.
         super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_5c8.trans.
    super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_2a0.
         super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_2a0.
    super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2a0.
    super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2a0.
    super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ::~vector(&local_518);
    local_518.
    super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)local_5c8.eps.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    local_518.
    super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)local_5c8.eps.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_518.
    super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)CONCAT44(local_5c8.eps.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                           local_5c8.eps.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
    local_5c8.eps.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
         SUB84(local_288.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
    local_5c8.eps.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         (undefined4)
         ((ulong)local_288.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage >> 0x20);
    local_5c8.eps.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_288.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_5c8.eps.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_288.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_288.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_288.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_288.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)&local_518);
    if ((void *)CONCAT44(local_5c8.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,
                         local_5c8.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._0_4_) !=
        (void *)0x0) {
      operator_delete((void *)CONCAT44(local_5c8.accepts.super__Bvector_base<std::allocator<bool>_>.
                                       _M_impl.super__Bvector_impl_data._M_start.
                                       super__Bit_iterator_base._M_p._4_4_,
                                       local_5c8.accepts.super__Bvector_base<std::allocator<bool>_>.
                                       _M_impl.super__Bvector_impl_data._M_start.
                                       super__Bit_iterator_base._M_p._0_4_));
    }
    local_5c8.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)local_250;
    local_5c8.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._8_8_ = CONCAT44(uStack_254,uStack_258);
    local_5c8.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)local_260;
    local_5c8.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_p._0_4_ = SUB84(local_270,0);
    local_5c8.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_p._4_4_ = (undefined4)((ulong)local_270 >> 0x20);
    local_5c8.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_offset = uStack_268;
    local_270 = (_Bit_type *)0x0;
    uStack_268 = 0;
    local_260 = (pointer)0x0;
    uStack_258 = 0;
    local_250 = (pointer)0x0;
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(&local_288);
    std::
    vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ::~vector(&local_2a0);
    boost::detail::shared_count::~shared_count((shared_count *)(local_2b8 + 8));
    __return_storage_ptr___00 = local_5d0;
    psVar7 = local_5d8;
    if (local_368 != (_Bit_type *)0x0) {
      operator_delete(local_368);
      local_368 = (_Bit_type *)0x0;
      local_360 = 0;
      local_358 = (_Bit_type *)0x0;
      local_350 = 0;
      local_348 = (_Bit_pointer)0x0;
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(&local_380);
    std::
    vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ::~vector(&local_398);
    boost::detail::shared_count::~shared_count(local_3a8);
    boost::unordered::detail::
    table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_unsigned_int,_unsigned_int,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
    ::~table(&local_3e0);
    if (local_3f8 != (pointer)0x0) {
      operator_delete(local_3f8);
    }
    CFGConnect::~CFGConnect(&local_480);
    CFG::~CFG((CFG *)local_500);
    pCVar6 = (CFG *)local_338;
  }
  else {
    if (avy::AvyLogFlag != '\0') {
      local_500._0_8_ = local_500 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_500,"verbose","");
      cVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)avy::AvyLog_abi_cxx11_,(key_type *)local_500);
      if ((undefined1 *)local_500._0_8_ != local_500 + 0x10) {
        operator_delete((void *)local_500._0_8_);
      }
      if (cVar4._M_node != (_Base_ptr)(avy::AvyLog_abi_cxx11_ + 8)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"The CFG is regular thus no need to abstract.\n",0x2d);
      }
    }
    CFG::CFG(&local_b0,local_5e0);
    StronglyRegularToFA<covenant::Sym>::StronglyRegularToFA
              ((StronglyRegularToFA<covenant::Sym> *)local_500,&local_b0);
    CFG::~CFG(&local_b0);
    StronglyRegularToFA<covenant::Sym>::make_fa
              ((DFA<covenant::Sym> *)local_338,(StronglyRegularToFA<covenant::Sym> *)local_500);
    uVar2 = local_338._8_8_;
    uVar1 = local_338._0_8_;
    local_338._0_8_ = (element_type *)0x0;
    local_338._8_8_ = (sp_counted_base *)0x0;
    local_2b8._0_8_ = local_5c8._tfac.px;
    local_2b8._8_8_ = local_5c8._tfac.pn.pi_;
    local_5c8._tfac.px = (element_type *)uVar1;
    local_5c8._tfac.pn.pi_ = (sp_counted_base *)uVar2;
    boost::detail::shared_count::~shared_count((shared_count *)(local_2b8 + 8));
    local_2b8._16_8_ =
         local_5c8.trans.
         super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_2b8._8_8_ =
         local_5c8.trans.
         super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_2b8._0_8_ =
         local_5c8.trans.
         super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_5c8.start = local_338._16_4_;
    local_5c8.trans.
    super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_320.
         super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_5c8.trans.
    super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_320.
         super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_5c8.trans.
    super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_320.
         super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_320.
    super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_320.
    super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_320.
    super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ::~vector((vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
               *)local_2b8);
    local_2b8._8_8_ =
         local_5c8.eps.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_2b8._0_8_ =
         local_5c8.eps.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_2b8._16_8_ =
         CONCAT44(local_5c8.eps.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                  local_5c8.eps.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
    local_5c8.eps.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
         SUB84(local_308.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
    local_5c8.eps.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         (undefined4)
         ((ulong)local_308.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage >> 0x20);
    local_5c8.eps.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_308.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_5c8.eps.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_308.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_308.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_308.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_308.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)local_2b8);
    if ((void *)CONCAT44(local_5c8.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,
                         local_5c8.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._0_4_) !=
        (void *)0x0) {
      operator_delete((void *)CONCAT44(local_5c8.accepts.super__Bvector_base<std::allocator<bool>_>.
                                       _M_impl.super__Bvector_impl_data._M_start.
                                       super__Bit_iterator_base._M_p._4_4_,
                                       local_5c8.accepts.super__Bvector_base<std::allocator<bool>_>.
                                       _M_impl.super__Bvector_impl_data._M_start.
                                       super__Bit_iterator_base._M_p._0_4_));
    }
    local_5c8.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)local_2d0;
    local_5c8.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._8_8_ = CONCAT44(uStack_2d4,uStack_2d8);
    local_5c8.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)local_2e0;
    local_5c8.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_p._0_4_ = SUB84(local_2f0,0);
    local_5c8.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_p._4_4_ = (undefined4)((ulong)local_2f0 >> 0x20);
    local_5c8.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_offset = uStack_2e8;
    local_2f0 = (pointer)0x0;
    uStack_2e8 = 0;
    local_2e0 = (pointer)0x0;
    uStack_2d8 = 0;
    local_2d0 = (pointer)0x0;
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(&local_308);
    std::
    vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ::~vector(&local_320);
    boost::detail::shared_count::~shared_count((shared_count *)(local_338 + 8));
    __return_storage_ptr___00 = local_5d0;
    psVar7 = local_5d8;
    if (local_368 != (_Bit_type *)0x0) {
      operator_delete(local_368);
      local_368 = (_Bit_type *)0x0;
      local_360 = 0;
      local_358 = (_Bit_type *)0x0;
      local_350 = 0;
      local_348 = (_Bit_pointer)0x0;
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(&local_380);
    std::
    vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ::~vector(&local_398);
    boost::detail::shared_count::~shared_count(local_3a8);
    boost::unordered::detail::
    table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_unsigned_int,_unsigned_int,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
    ::~table(&local_3e0);
    if (local_3f8 != (pointer)0x0) {
      operator_delete(local_3f8);
    }
    CFGConnect::~CFGConnect(&local_480);
    pCVar6 = (CFG *)local_500;
  }
  CFG::~CFG(pCVar6);
  DFA<covenant::Sym>::eps_elim(&local_5c8);
  pCVar6 = local_5e0;
  DFA<covenant::Sym>::makeDFA((dfa_t *)local_500,&local_5c8,local_5e0->alphstart,local_5e0->alphsz);
  DFA<covenant::Sym>::minimize
            (__return_storage_ptr___00,(DFA<covenant::Sym> *)local_500,pCVar6->alphstart,
             pCVar6->alphsz);
  bVar3 = DFA<covenant::Sym>::eliminateDeadStates(__return_storage_ptr___00);
  if (bVar3) {
    if (local_4b8 != (pointer)0x0) {
      operator_delete(local_4b8);
      local_4b8 = (pointer)0x0;
      local_4b0 = 0;
      local_4a8 = (pointer)0x0;
      local_4a0 = 0;
      local_498 = (pointer)0x0;
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(&local_4d0);
    std::
    vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ::~vector((vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
               *)(local_500 + 0x18));
    boost::detail::shared_count::~shared_count((shared_count *)(local_500 + 8));
    if ((void *)CONCAT44(local_5c8.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,
                         local_5c8.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._0_4_) !=
        (void *)0x0) {
      operator_delete((void *)CONCAT44(local_5c8.accepts.super__Bvector_base<std::allocator<bool>_>.
                                       _M_impl.super__Bvector_impl_data._M_start.
                                       super__Bit_iterator_base._M_p._4_4_,
                                       local_5c8.accepts.super__Bvector_base<std::allocator<bool>_>.
                                       _M_impl.super__Bvector_impl_data._M_start.
                                       super__Bit_iterator_base._M_p._0_4_));
      local_5c8.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p._0_4_ = 0;
      local_5c8.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p._4_4_ = 0;
      local_5c8.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_offset = 0;
      local_5c8.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_5c8.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._8_8_ =
           local_5c8.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
      local_5c8.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(&local_5c8.eps);
    std::
    vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ::~vector(&local_5c8.trans);
    boost::detail::shared_count::~shared_count(psVar7);
    return __return_storage_ptr___00;
  }
  psVar5 = (string *)__cxa_allocate_exception(0x20);
  if ((char)local_5e4 != '\0') {
    local_538 = local_528;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_538,"One CFG is trivially empty.\n======\nUNSAT\n======","");
    *(string **)psVar5 = psVar5 + 0x10;
    std::__cxx11::string::_M_construct<char*>(psVar5,local_538,local_538 + local_530);
    __cxa_throw(psVar5,&Exit::typeinfo,Exit::~Exit);
  }
  local_558 = local_548;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_558,"One CFG is empty after abstraction.\n======\nUNSAT\n======","");
  *(string **)psVar5 = psVar5 + 0x10;
  std::__cxx11::string::_M_construct<char*>(psVar5,local_558,local_558 + local_550);
  __cxa_throw(psVar5,&Exit::typeinfo,Exit::~Exit);
}

Assistant:

DFA<EdgeSym> do_abstraction(CFG &g, const bool is_regular)
  {
    bool is_abs_done = false;
    DFA<EdgeSym> sfa (g.getTermFactory ());
    if (is_regular)
    {        
      LOG( "verbose", cout << "The CFG is regular thus no need to abstract.\n");

      StronglyRegularToFA<EdgeSym>  conv(g);
      sfa = conv.make_fa();
    }
    else
    {
      LOG( "verbose" , cout << "Applied cycle breaking abstraction.\n");
      is_abs_done = true;
      CycleBreaking<EdgeSym> transformer;
      CFG str_reg_cfg = transformer.Approximate(g);

      LOG ("abstraction" , 
           cout << "Approximated regular grammar:\n" << str_reg_cfg);

      StronglyRegularToFA<EdgeSym> conv(str_reg_cfg);
      sfa = conv.make_fa();
    }

    /// Simplify the automata
    sfa.eps_elim();

    DFA<EdgeSym> dfa     = sfa.makeDFA (g.alphstart, g.alphsz);
    DFA<EdgeSym> min_dfa = dfa.minimize (g.alphstart, g.alphsz);
    bool is_not_empty    = min_dfa.eliminateDeadStates();
    if (!is_not_empty)
    {
      if  (!is_abs_done) 
        throw Exit("One CFG is trivially empty.\n======\nUNSAT\n======");
      else
        throw Exit("One CFG is empty after abstraction.\n======\nUNSAT\n======");
    }
    return min_dfa;
  }